

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O0

void reset_group_input_file(gengetopt_args_info *args_info)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x134) != 0) {
    *(undefined4 *)(in_RDI + 0x100) = 0;
    free_string_field((char **)0x130952);
    free_string_field((char **)0x13095f);
    *(undefined4 *)(in_RDI + 0x104) = 0;
    free_string_field((char **)0x13097a);
    free_string_field((char **)0x130987);
    *(undefined4 *)(in_RDI + 0x108) = 0;
    free_string_field((char **)0x1309a2);
    free_string_field((char **)0x1309af);
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    free_string_field((char **)0x1309ca);
    free_string_field((char **)0x1309d7);
    *(undefined4 *)(in_RDI + 0x134) = 0;
  }
  return;
}

Assistant:

static void
reset_group_input_file(struct gengetopt_args_info *args_info)
{
  if (! args_info->input_file_group_counter)
    return;
  
  args_info->input_given = 0 ;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  args_info->xyz_given = 0 ;
  free_string_field (&(args_info->xyz_arg));
  free_string_field (&(args_info->xyz_orig));
  args_info->stl_given = 0 ;
  free_string_field (&(args_info->stl_arg));
  free_string_field (&(args_info->stl_orig));
  args_info->msms_given = 0 ;
  free_string_field (&(args_info->msms_arg));
  free_string_field (&(args_info->msms_orig));

  args_info->input_file_group_counter = 0;
}